

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

void des3_cbc1_cbc_encrypt(ssh_cipher *ciph,void *vdata,int len)

{
  LR LVar1;
  
  for (; 0 < len; len = len + -8) {
    LVar1 = des_load_lr(vdata);
    LVar1 = des_IP((LR)((ulong)LVar1 ^ (ulong)ciph[-1].vt));
    LVar1 = des_inner_cipher(LVar1,(des_keysched *)(ciph + -0x31),0,1);
    LVar1 = des_inner_cipher(LVar1,(des_keysched *)(ciph + -0x21),0xf,0xffffffffffffffff);
    LVar1 = des_inner_cipher(LVar1,(des_keysched *)(ciph + -0x11),0,1);
    LVar1 = des_FP(LVar1);
    des_store_lr(vdata,LVar1);
    *(LR *)(ciph + -1) = LVar1;
    vdata = (void *)((long)vdata + 8);
  }
  return;
}

Assistant:

static void des3_cbc1_cbc_encrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des3_cbc1_ctx *ctx = container_of(ciph, struct des3_cbc1_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        LR plaintext = des_load_lr(data);
        LR cipher_in = des_xor_lr(plaintext, ctx->iv);

        /* Run three copies of the cipher, without undoing and redoing
         * IP/FP in between. */
        LR lr = des_IP(cipher_in);
        lr = des_inner_cipher(lr, &ctx->sched[0], ENCIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[1], DECIPHER);
        lr = des_inner_cipher(lr, &ctx->sched[2], ENCIPHER);
        LR ciphertext = des_FP(lr);

        des_store_lr(data, ciphertext);
        ctx->iv = ciphertext;
    }
}